

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O2

int anon_unknown.dwarf_227fc::ChannelOut_allsoundoff(lua_State *L)

{
  ChannelOut *this;
  
  this = getChannelOut(L,1);
  ChannelOut::send<int,int,int>(this,this->index + 0xb0,0x78,0);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_allsoundoff(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	self.send(0xB0 + self.index, 0x78, 0x00);
	lua_settop(L, 1);
	return 1;
}